

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

Hash __thiscall
Fossilize::StateRecorder::Impl::record_shader_module
          (Impl *this,WorkItem *record_item,bool dependent_record)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *blob;
  VkShaderModuleCreateInfo *create_info;
  pointer puVar1;
  VkShaderModule pVVar2;
  VkShaderModuleCreateInfo *pVVar3;
  bool bVar4;
  char cVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  mapped_type *ppVVar9;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *ident;
  ulong uVar10;
  Impl *this_00;
  Hash hash;
  VkShaderModule_T *vk_object;
  VkShaderModuleCreateInfo *create_info_copy;
  VkShaderModule local_40;
  key_type local_38;
  VkShaderModuleCreateInfo *local_30;
  
  create_info = (VkShaderModuleCreateInfo *)record_item->create_info;
  local_40 = (VkShaderModule)record_item->custom_hash;
  local_38 = (key_type)record_item->handle;
  if (local_40 == (VkShaderModule)0x0) {
    if (create_info == (VkShaderModuleCreateInfo *)0x0) {
      std::
      _Hashtable<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->shader_module_to_hash)._M_h,&local_38);
      return (Hash)local_40;
    }
    if (create_info->codeSize < 4) {
      uVar6 = 0xaf63bd4c8601b7df;
    }
    else {
      uVar6 = 0xcbf29ce484222325;
      uVar10 = 0;
      do {
        uVar6 = (ulong)create_info->pCode[uVar10] ^ uVar6 * 0x100000001b3;
        uVar10 = uVar10 + 1;
      } while (create_info->codeSize >> 2 != uVar10);
      uVar6 = uVar6 * 0x100000001b3;
    }
    local_40 = (VkShaderModule)(create_info->flags ^ uVar6);
  }
  if (local_40 != (VkShaderModule)0x0) {
    register_on_use(this,RESOURCE_SHADER_MODULE,(Hash)local_40);
  }
  pVVar2 = local_40;
  if (record_item->handle != 0) {
    pmVar7 = std::__detail::
             _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_unsigned_long>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->shader_module_to_hash,&local_38);
    *pmVar7 = (mapped_type)pVVar2;
  }
  if (this->database_iface == (DatabaseInterface *)0x0) {
    sVar8 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&(this->shader_modules)._M_h,(key_type *)&local_40);
    if (sVar8 == 0) {
      local_30 = (mapped_type)0x0;
      bVar4 = copy_shader_module(this,create_info,&this->allocator,false,&local_30);
      pVVar3 = local_30;
      if (bVar4) {
        ppVVar9 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->shader_modules,(key_type *)&local_40);
        *ppVVar9 = pVVar3;
      }
    }
  }
  else {
    if ((this->record_data).write_database_entries == true) {
      blob = &(this->record_data).blob;
      bVar4 = register_application_link_hash(this,RESOURCE_SHADER_MODULE,(Hash)local_40,blob);
      if (bVar4) {
        (this->record_data).need_flush = true;
      }
      this_00 = (Impl *)this->database_iface;
      cVar5 = (*(code *)(this_00->allocator).impl[1].blocks.
                        super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                        ._M_impl.super__Vector_impl_data._M_finish)(this_00,4,local_40);
      if (cVar5 == '\0') {
        serialize_shader_module(this_00,(Hash)local_40,create_info,blob,&this->allocator);
        puVar1 = (this->record_data).blob.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (*this->database_iface->_vptr_DatabaseInterface[4])
                  (this->database_iface,4,local_40,puVar1,
                   (long)(this->record_data).blob.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar1,
                   (ulong)(this->record_data).payload_flags);
        (this->record_data).need_flush = true;
      }
    }
    if (!dependent_record) {
      ScratchAllocator::reset(&this->allocator);
    }
  }
  if (this->module_identifier_database_iface != (DatabaseInterface *)0x0 && !dependent_record) {
    for (ident = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)create_info->pNext;
        ident != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
        ident = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)ident->pNext) {
      if (ident->sType == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT)
      goto LAB_0013b7f6;
    }
    ident = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
LAB_0013b7f6:
    if (ident != (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
      register_module_identifier(this,local_40,ident);
    }
  }
  return (Hash)local_40;
}

Assistant:

Hash StateRecorder::Impl::record_shader_module(const WorkItem &record_item, bool dependent_record)
{
	auto *create_info = reinterpret_cast<VkShaderModuleCreateInfo *>(record_item.create_info);
	Hash hash = record_item.custom_hash;
	auto vk_object = api_object_cast<VkShaderModule>(record_item.handle);

	if (hash == 0)
	{
		if (!create_info || !Hashing::compute_hash_shader_module(*create_info, &hash))
		{
			shader_module_to_hash.erase(vk_object);
			return hash;
		}
	}

	if (hash)
		register_on_use(RESOURCE_SHADER_MODULE, hash);

	if (record_item.handle != 0)
		shader_module_to_hash[vk_object] = hash;

	auto &blob = record_data.blob;

	if (database_iface)
	{
		if (record_data.write_database_entries)
		{
			if (register_application_link_hash(RESOURCE_SHADER_MODULE, hash, blob))
				record_data.need_flush = true;

			if (!database_iface->has_entry(RESOURCE_SHADER_MODULE, hash))
			{
				if (serialize_shader_module(hash, *create_info, blob, allocator))
				{
					database_iface->write_entry(RESOURCE_SHADER_MODULE, hash, blob.data(), blob.size(),
												record_data.payload_flags);
					record_data.need_flush = true;
				}
			}
		}

		// If this is called as part of a graphics pipeline library call, we must be very careful not
		// to reclaim the scratch allocator memory (yet). Otherwise we risk corruption.
		if (!dependent_record)
			allocator.reset();
	}
	else
	{
		// Retain for combined serialize() later.
		if (!shader_modules.count(hash))
		{
			VkShaderModuleCreateInfo *create_info_copy = nullptr;
			if (copy_shader_module(create_info, allocator, false, &create_info_copy))
				shader_modules[hash] = create_info_copy;
		}
	}

	// If we're a dependent record, the pipeline remapping logic will ensure to register the module.
	if (module_identifier_database_iface && !dependent_record)
	{
		auto *identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, create_info->pNext);
		if (identifier)
			register_module_identifier(api_object_cast<VkShaderModule>(hash), *identifier);
	}

	return hash;
}